

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O0

bool chapter2::find_elem(int pos,int *elem)

{
  bool bVar1;
  ostream *this;
  void *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  const_reference pvVar2;
  vector<int,_std::allocator<int>_> *ptr;
  int *elem_local;
  int pos_local;
  
  bVar1 = check_validity(pos);
  if (bVar1) {
    this_01 = pent_series(pos);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)(pos + -1));
    *elem = *pvVar2;
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,"Sorry, Invalid position.");
    this_00 = (void *)std::ostream::operator<<(this,pos);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    *elem = 0;
  }
  return bVar1;
}

Assistant:

bool find_elem(int pos, int &elem) {
        if (!check_validity(pos)) {
            cerr << "Sorry, Invalid position." << pos << endl;
            elem = 0;
            return false;
        }

        const vector<int> * ptr = pent_series(pos);
        elem = (*ptr)[pos - 1];
        return true;
    }